

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_wipe.cpp
# Opt level: O1

bool wipe_doBurn(int ticks)

{
  int iVar1;
  BYTE *pBVar2;
  uint uVar3;
  int iVar4;
  short *psVar5;
  int iVar6;
  int iVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  short *psVar11;
  BYTE *pBVar12;
  long lVar13;
  int iVar14;
  BYTE *pBVar15;
  
  burntime = burntime + ticks;
  if (ticks == 0) {
    iVar9 = 0;
  }
  else {
    iVar6 = ticks * -2;
    do {
      iVar6 = iVar6 + 1;
      density = wipe_CalcBurn(burnarray,0x40,0x40,density);
      iVar9 = -(density >> 0x1f);
      if (iVar9 != 0) break;
    } while (iVar6 != 0);
  }
  pBVar2 = burnarray;
  bVar8 = (byte)iVar9;
  iVar6 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
  iVar10 = 0;
  iVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
  if (0 < iVar1) {
    pBVar12 = (screen->super_DSimpleCanvas).super_DCanvas.Buffer;
    iVar7 = 0;
    psVar5 = wipe_scr_end;
    psVar11 = wipe_scr_start;
    do {
      iVar4 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
      if (0 < iVar4) {
        lVar13 = 0;
        iVar14 = 0;
        do {
          bVar8 = pBVar2[(int)((iVar14 >> 0x10) + (iVar10 >> 10 & 0xffffffc0U))];
          if (bVar8 < 0x7e) {
            if (bVar8 < 2) {
              pBVar15 = (BYTE *)((long)psVar11 + lVar13);
            }
            else {
              uVar3 = Col2RGB8[(byte)(0x40 - (bVar8 >> 1))][*(byte *)((long)psVar11 + lVar13)] +
                      Col2RGB8[bVar8 >> 1][*(byte *)((long)psVar5 + lVar13)] | 0x1f07c1f;
              pBVar15 = RGB32k.All + (uVar3 >> 0xf & uVar3);
            }
            iVar9 = 0;
          }
          else {
            pBVar15 = (BYTE *)((long)psVar5 + lVar13);
          }
          pBVar12[lVar13] = *pBVar15;
          lVar13 = lVar13 + 1;
          iVar14 = iVar14 + (int)(0x400000 / (long)iVar6);
          iVar4 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
        } while (lVar13 < iVar4);
      }
      bVar8 = (byte)iVar9;
      psVar11 = (short *)((long)psVar11 + (long)iVar4);
      psVar5 = (short *)((long)psVar5 + (long)iVar4);
      pBVar12 = pBVar12 + (screen->super_DSimpleCanvas).super_DCanvas.Pitch;
      iVar7 = iVar7 + 1;
      iVar10 = iVar10 + (int)(0x400000 / (long)iVar1);
    } while (iVar7 < (screen->super_DSimpleCanvas).super_DCanvas.Height);
  }
  return (bool)(0x28 < burntime | bVar8 & 1);
}

Assistant:

bool wipe_doBurn (int ticks)
{
	bool done;

	burntime += ticks;
	ticks *= 2;

	// Make the fire burn
	done = false;
	while (!done && ticks--)
	{
		density = wipe_CalcBurn(burnarray, FIREWIDTH, FIREHEIGHT, density);
		done = (density < 0);
	}

	// Draw the screen
	int xstep, ystep, firex, firey;
	int x, y;
	BYTE *to, *fromold, *fromnew;
	const int SHIFT = 16;

	xstep = (FIREWIDTH << SHIFT) / SCREENWIDTH;
	ystep = (FIREHEIGHT << SHIFT) / SCREENHEIGHT;
	to = screen->GetBuffer();
	fromold = (BYTE *)wipe_scr_start;
	fromnew = (BYTE *)wipe_scr_end;

	for (y = 0, firey = 0; y < SCREENHEIGHT; y++, firey += ystep)
	{
		for (x = 0, firex = 0; x < SCREENWIDTH; x++, firex += xstep)
		{
			int fglevel;

			fglevel = burnarray[(firex>>SHIFT)+(firey>>SHIFT)*FIREWIDTH] / 2;
			if (fglevel >= 63)
			{
				to[x] = fromnew[x];
			}
			else if (fglevel == 0)
			{
				to[x] = fromold[x];
				done = false;
			}
			else
			{
				int bglevel = 64-fglevel;
				DWORD *fg2rgb = Col2RGB8[fglevel];
				DWORD *bg2rgb = Col2RGB8[bglevel];
				DWORD fg = fg2rgb[fromnew[x]];
				DWORD bg = bg2rgb[fromold[x]];
				fg = (fg+bg) | 0x1f07c1f;
				to[x] = RGB32k.All[fg & (fg>>15)];
				done = false;
			}
		}
		fromold += SCREENWIDTH;
		fromnew += SCREENWIDTH;
		to += SCREENPITCH;
	}

	return done || (burntime > 40);
}